

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_updateDUBT(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls)

{
  long *p;
  uint h;
  U32 UVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  U32 *pUVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar5 = (ms->cParams).chainLog;
  if (iend < ip + 8) {
    __assert_fail("ip + 8 <= iend",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x739e,
                  "void ZSTD_updateDUBT(ZSTD_matchState_t *, const BYTE *, const BYTE *, U32)");
  }
  uVar9 = (ulong)ms->nextToUpdate;
  if (ms->nextToUpdate < (ms->window).dictLimit) {
    __assert_fail("idx >= ms->window.dictLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x73a1,
                  "void ZSTD_updateDUBT(ZSTD_matchState_t *, const BYTE *, const BYTE *, U32)");
  }
  pBVar2 = (ms->window).base;
  pUVar3 = ms->hashTable;
  h = (ms->cParams).hashLog;
  pUVar4 = ms->chainTable;
  uVar8 = (long)ip - (long)pBVar2;
  do {
    if ((uVar8 & 0xffffffff) <= uVar9) {
      ms->nextToUpdate = (U32)uVar8;
      return;
    }
    if (0x20 < h) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    p = (long *)(pBVar2 + uVar9);
    switch(mls) {
    case 5:
      uVar6 = *p * -0x30e4432345000000;
      goto LAB_0019ead8;
    case 6:
      uVar6 = ZSTD_hash6Ptr(p,h);
      break;
    case 7:
      uVar6 = *p * -0x30e44323405a9d00;
LAB_0019ead8:
      uVar6 = uVar6 >> (0x40U - (char)h & 0x3f);
      break;
    case 8:
      uVar6 = ZSTD_hash8Ptr(p,h);
      break;
    default:
      uVar6 = (ulong)((uint)((int)*p * -0x61c8864f) >> (0x20U - (char)h & 0x1f));
    }
    UVar1 = pUVar3[uVar6];
    uVar7 = (ulong)(((uint)uVar9 & ~(-1 << ((char)uVar5 - 1U & 0x1f))) * 2);
    pUVar3[uVar6] = (uint)uVar9;
    pUVar4[uVar7] = UVar1;
    pUVar4[uVar7 + 1] = 1;
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static void
ZSTD_updateDUBT(ZSTD_matchState_t* ms,
                const BYTE* ip, const BYTE* iend,
                U32 mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32  const hashLog = cParams->hashLog;

    U32* const bt = ms->chainTable;
    U32  const btLog  = cParams->chainLog - 1;
    U32  const btMask = (1 << btLog) - 1;

    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32 idx = ms->nextToUpdate;

    if (idx != target)
        DEBUGLOG(7, "ZSTD_updateDUBT, from %u to %u (dictLimit:%u)",
                    idx, target, ms->window.dictLimit);
    assert(ip + 8 <= iend);   /* condition for ZSTD_hashPtr */
    (void)iend;

    assert(idx >= ms->window.dictLimit);   /* condition for valid base+idx */
    for ( ; idx < target ; idx++) {
        size_t const h  = ZSTD_hashPtr(base + idx, hashLog, mls);   /* assumption : ip + 8 <= iend */
        U32    const matchIndex = hashTable[h];

        U32*   const nextCandidatePtr = bt + 2*(idx&btMask);
        U32*   const sortMarkPtr  = nextCandidatePtr + 1;

        DEBUGLOG(8, "ZSTD_updateDUBT: insert %u", idx);
        hashTable[h] = idx;   /* Update Hash Table */
        *nextCandidatePtr = matchIndex;   /* update BT like a chain */
        *sortMarkPtr = ZSTD_DUBT_UNSORTED_MARK;
    }
    ms->nextToUpdate = target;
}